

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O1

void attribute_destroy(attribute_conflict attr)

{
  attribute_impl_interface_destroy p_Var1;
  
  if (attr != (attribute_conflict)0x0) {
    if ((attr->iface != (attribute_interface)0x0) &&
       (p_Var1 = attr->iface->destroy, p_Var1 != (attribute_impl_interface_destroy)0x0)) {
      (*p_Var1)(attr,attr->impl);
    }
    if (attr->name != (char *)0x0) {
      free(attr->name);
    }
    free(attr);
    return;
  }
  return;
}

Assistant:

void attribute_destroy(attribute attr)
{
	if (attr)
	{
		if (attr->iface && attr->iface->destroy)
		{
			attr->iface->destroy(attr, attr->impl);
		}

		if (attr->name)
		{
			free(attr->name);
		}

		free(attr);
	}
}